

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O3

uint __thiscall QFileInfoPrivate::getFileFlags(QFileInfoPrivate *this,FileFlags request)

{
  QAbstractFileEngine *pQVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  
  if (((uint)request.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
             super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i & 0xfff0000) == 0) {
    uVar2 = 0;
    uVar4 = 0;
  }
  else {
    uVar3 = ~*(uint *)&this->field_0x1d8;
    bVar6 = (uVar3 & 0x80000001) != 0;
    uVar4 = 0xff60000;
    if (!bVar6) {
      uVar4 = 0;
    }
    bVar5 = ((uint)request.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
                   super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i >> 0x10 & 1) == 0;
    bVar7 = (uVar3 & 0x80000002) == 0;
    uVar2 = uVar4 + 0x10000;
    if (bVar7 || bVar5) {
      uVar2 = uVar4;
    }
    uVar4 = bVar6 + 2;
    if (bVar7 || bVar5) {
      uVar4 = (uint)bVar6;
    }
    if ((uVar3 & 0x80000004) != 0 &&
        ((uint)request.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
               super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i >> 0x13 & 1) != 0) {
      uVar2 = uVar2 | 0x80000;
      uVar4 = uVar4 | 4;
    }
  }
  if (((short)request.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
              super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i == 0) ||
     (uVar3 = *(uint *)&this->field_0x1d8, (~uVar3 & 0x80000100) == 0)) {
    if (uVar2 == 0) {
      uVar2 = this->fileFlags;
      goto LAB_0010e682;
    }
    uVar3 = *(uint *)&this->field_0x1d8;
  }
  else {
    uVar2 = uVar2 | 0xffff;
    uVar4 = uVar4 | 0x100;
  }
  pQVar1 = (this->fileEngine)._M_t.
           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
           _M_t.
           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
           super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
  uVar2 = (*pQVar1->_vptr_QAbstractFileEngine[0x16])
                    (pQVar1,(ulong)(~uVar3 >> 7 & 0x1000000 | uVar2 & 0xfeffffff));
  uVar2 = uVar2 | this->fileFlags;
  this->fileFlags = uVar2;
  if ((int)*(uint *)&this->field_0x1d8 < 0) {
    *(uint *)&this->field_0x1d8 = *(uint *)&this->field_0x1d8 | uVar4;
  }
LAB_0010e682:
  return uVar2 & (uint)request.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
                       super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i;
}

Assistant:

uint QFileInfoPrivate::getFileFlags(QAbstractFileEngine::FileFlags request) const
{
    Q_ASSERT(fileEngine); // should never be called when using the native FS
    // We split the testing into tests for for LinkType, BundleType, PermsMask
    // and the rest.
    // Tests for file permissions on Windows can be slow, especially on network
    // paths and NTFS drives.
    // In order to determine if a file is a symlink or not, we have to lstat().
    // If we're not interested in that information, we might as well avoid one
    // extra syscall. Bundle detecton on Mac can be slow, especially on network
    // paths, so we separate out that as well.

    QAbstractFileEngine::FileFlags req;
    uint cachedFlags = 0;

    if (request & (QAbstractFileEngine::FlagsMask | QAbstractFileEngine::TypesMask)) {
        if (!getCachedFlag(CachedFileFlags)) {
            req |= QAbstractFileEngine::FlagsMask;
            req |= QAbstractFileEngine::TypesMask;
            req &= (~QAbstractFileEngine::LinkType);
            req &= (~QAbstractFileEngine::BundleType);

            cachedFlags |= CachedFileFlags;
        }

        if (request & QAbstractFileEngine::LinkType) {
            if (!getCachedFlag(CachedLinkTypeFlag)) {
                req |= QAbstractFileEngine::LinkType;
                cachedFlags |= CachedLinkTypeFlag;
            }
        }

        if (request & QAbstractFileEngine::BundleType) {
            if (!getCachedFlag(CachedBundleTypeFlag)) {
                req |= QAbstractFileEngine::BundleType;
                cachedFlags |= CachedBundleTypeFlag;
            }
        }
    }

    if (request & QAbstractFileEngine::PermsMask) {
        if (!getCachedFlag(CachedPerms)) {
            req |= QAbstractFileEngine::PermsMask;
            cachedFlags |= CachedPerms;
        }
    }

    if (req) {
        if (cache_enabled)
            req &= (~QAbstractFileEngine::Refresh);
        else
            req |= QAbstractFileEngine::Refresh;

        QAbstractFileEngine::FileFlags flags = fileEngine->fileFlags(req);
        fileFlags |= uint(flags.toInt());
        setCachedFlag(cachedFlags);
    }

    return fileFlags & request.toInt();
}